

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::GenerateAccessorDeclarations
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  CType CVar1;
  CType CVar2;
  
  CVar1 = *(CType *)(*(long *)(this->descriptor_ + 0x80) + 0x68);
  CVar2 = EffectiveStringCType(this->descriptor_);
  if (CVar1 == CVar2) {
    io::Printer::Print(printer,&this->variables_,
                       "$deprecated_attr$const ::std::string& $name$(int index) const;\n$deprecated_attr$::std::string* mutable_$name$(int index);\n$deprecated_attr$void set_$name$(int index, const ::std::string& value);\n#if LANG_CXX11\n$deprecated_attr$void set_$name$(int index, ::std::string&& value);\n#endif\n$deprecated_attr$void set_$name$(int index, const char* value);\n$deprecated_attr$void set_$name$(int index, const $pointer_type$* value, size_t size);\n$deprecated_attr$::std::string* add_$name$();\n$deprecated_attr$void add_$name$(const ::std::string& value);\n#if LANG_CXX11\n$deprecated_attr$void add_$name$(::std::string&& value);\n#endif\n$deprecated_attr$void add_$name$(const char* value);\n$deprecated_attr$void add_$name$(const $pointer_type$* value, size_t size);\n$deprecated_attr$const ::google::protobuf::RepeatedPtrField< ::std::string>& $name$() const;\n$deprecated_attr$::google::protobuf::RepeatedPtrField< ::std::string>* mutable_$name$();\n"
                      );
    return;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer," private:\n  // Hidden due to unknown ctype option.\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecated_attr$const ::std::string& $name$(int index) const;\n$deprecated_attr$::std::string* mutable_$name$(int index);\n$deprecated_attr$void set_$name$(int index, const ::std::string& value);\n#if LANG_CXX11\n$deprecated_attr$void set_$name$(int index, ::std::string&& value);\n#endif\n$deprecated_attr$void set_$name$(int index, const char* value);\n$deprecated_attr$void set_$name$(int index, const $pointer_type$* value, size_t size);\n$deprecated_attr$::std::string* add_$name$();\n$deprecated_attr$void add_$name$(const ::std::string& value);\n#if LANG_CXX11\n$deprecated_attr$void add_$name$(::std::string&& value);\n#endif\n$deprecated_attr$void add_$name$(const char* value);\n$deprecated_attr$void add_$name$(const $pointer_type$* value, size_t size);\n$deprecated_attr$const ::google::protobuf::RepeatedPtrField< ::std::string>& $name$() const;\n$deprecated_attr$::google::protobuf::RepeatedPtrField< ::std::string>* mutable_$name$();\n"
                    );
  io::Printer::Outdent(printer);
  io::Printer::Print(printer," public:\n");
  io::Printer::Indent(printer);
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateAccessorDeclarations(io::Printer* printer) const {
  // See comment above about unknown ctypes.
  bool unknown_ctype =
      descriptor_->options().ctype() != EffectiveStringCType(descriptor_);

  if (unknown_ctype) {
    printer->Outdent();
    printer->Print(
      " private:\n"
      "  // Hidden due to unknown ctype option.\n");
    printer->Indent();
  }

  printer->Print(variables_,
    "$deprecated_attr$const ::std::string& $name$(int index) const;\n"
    "$deprecated_attr$::std::string* mutable_$name$(int index);\n"
    "$deprecated_attr$void set_$name$(int index, const ::std::string& value);\n"
    "#if LANG_CXX11\n"
    "$deprecated_attr$void set_$name$(int index, ::std::string&& value);\n"
    "#endif\n"
    "$deprecated_attr$void set_$name$(int index, const char* value);\n"
    ""
    "$deprecated_attr$void set_$name$("
                 "int index, const $pointer_type$* value, size_t size);\n"
    "$deprecated_attr$::std::string* add_$name$();\n"
    "$deprecated_attr$void add_$name$(const ::std::string& value);\n"
    "#if LANG_CXX11\n"
    "$deprecated_attr$void add_$name$(::std::string&& value);\n"
    "#endif\n"
    "$deprecated_attr$void add_$name$(const char* value);\n"
    "$deprecated_attr$void add_$name$(const $pointer_type$* value, size_t size)"
                 ";\n"
    "$deprecated_attr$const ::google::protobuf::RepeatedPtrField< ::std::string>& $name$() "
                 "const;\n"
    "$deprecated_attr$::google::protobuf::RepeatedPtrField< ::std::string>* mutable_$name$()"
                 ";\n");

  if (unknown_ctype) {
    printer->Outdent();
    printer->Print(" public:\n");
    printer->Indent();
  }
}